

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_string_radix_sort.h
# Opt level: O1

void __thiscall
parallel_string_radix_sort::ParallelStringRadixSort<const_unsigned_char_*>::Sort8
          (ParallelStringRadixSort<const_unsigned_char_*> *this,size_t bgn,size_t end,size_t depth,
          bool flip)

{
  uint8_t *puVar1;
  long lVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  size_t i_1;
  uchar **ppuVar9;
  size_t bgn_00;
  long lVar10;
  size_t sVar11;
  undefined7 in_register_00000081;
  ulong depth_00;
  size_t cnt [256];
  size_t local_840 [258];
  
  memset(local_840 + 1,0,0x800);
  ppuVar9 = this->temp_;
  ppuVar4 = this->data_;
  if ((int)CONCAT71(in_register_00000081,flip) != 0) {
    ppuVar9 = this->data_;
    ppuVar4 = this->temp_;
  }
  puVar1 = this->letters8_;
  sVar8 = bgn;
  if (end != bgn) {
    do {
      puVar1[sVar8] = ppuVar4[sVar8][depth];
      sVar8 = sVar8 + 1;
    } while (end != sVar8);
  }
  sVar8 = bgn;
  if (end != bgn) {
    do {
      local_840[(ulong)puVar1[sVar8] + 1] = local_840[(ulong)puVar1[sVar8] + 1] + 1;
      sVar8 = sVar8 + 1;
    } while (end != sVar8);
  }
  lVar10 = 0;
  lVar6 = 0;
  do {
    lVar2 = local_840[lVar10 + 1];
    local_840[lVar10 + 1] = lVar6;
    lVar10 = lVar10 + 1;
    lVar6 = lVar2 + lVar6;
  } while (lVar10 != 0x100);
  sVar8 = bgn;
  if (end != bgn) {
    do {
      lVar6 = local_840[(ulong)puVar1[sVar8] + 1];
      local_840[(ulong)puVar1[sVar8] + 1] = lVar6 + 1;
      puVar3 = ppuVar9[bgn + lVar6];
      ppuVar9[bgn + lVar6] = ppuVar4[sVar8];
      ppuVar4[sVar8] = puVar3;
      sVar8 = sVar8 + 1;
    } while (end != sVar8);
  }
  if ((!flip) && (local_840[1] != 0)) {
    lVar6 = 0;
    do {
      puVar3 = ppuVar4[bgn + lVar6];
      ppuVar4[bgn + lVar6] = ppuVar9[bgn + lVar6];
      ppuVar9[bgn + lVar6] = puVar3;
      lVar6 = lVar6 + 1;
    } while (local_840[1] != lVar6);
  }
  depth_00 = depth + 1;
  lVar6 = 1;
  local_840[0] = bgn;
  do {
    uVar5 = local_840[lVar6 + 1] - local_840[lVar6];
    if (uVar5 != 0) {
      bgn_00 = local_840[lVar6] + bgn;
      sVar8 = local_840[lVar6 + 1] + bgn;
      if ((depth_00 < 100) && (0x1e < uVar5)) {
        if (uVar5 < 0x10000) {
          Sort8(this,bgn_00,sVar8,depth_00,!flip);
        }
        else {
          Sort16(this,bgn_00,sVar8,depth_00,!flip);
        }
      }
      else {
        uVar7 = uVar5;
        sVar11 = bgn_00;
        if (bgn_00 < sVar8 && !flip) {
          do {
            ppuVar4 = this->temp_;
            puVar3 = this->data_[sVar11];
            this->data_[sVar11] = ppuVar4[sVar11];
            ppuVar4[sVar11] = puVar3;
            uVar7 = uVar7 - 1;
            sVar11 = sVar11 + 1;
          } while (uVar7 != 0);
        }
        if (1 < uVar5) {
          ppuVar4 = this->data_ + sVar8;
          ppuVar9 = this->data_ + bgn_00;
          uVar5 = (long)(sVar8 * 8 + bgn_00 * -8) >> 3;
          lVar10 = 0x3f;
          if (uVar5 != 0) {
            for (; uVar5 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          std::
          __introsort_loop<unsigned_char_const**,long,__gnu_cxx::__ops::_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<unsigned_char_const*>>>
                    (ppuVar9,ppuVar4,(ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,
                     (_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<const_unsigned_char_*>_>
                      )(int)depth_00);
          bgn = local_840[0];
          std::
          __final_insertion_sort<unsigned_char_const**,__gnu_cxx::__ops::_Iter_comp_iter<parallel_string_radix_sort::internal::Compare<unsigned_char_const*>>>
                    (ppuVar9,ppuVar4,(Compare<const_unsigned_char_*>)(int)depth_00);
        }
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x100);
  return;
}

Assistant:

void ParallelStringRadixSort<StringType>
::Sort8(size_t bgn, size_t end, size_t depth, bool flip) {
  // Here we do not use |new| or |malloc|. This is because:
  // 1. these may be heavy bottle-necks under multi-thread, and
  // 2. the size is sufficiently small for preventing stack overflow.
  size_t cnt[1 << 8] = {};

  StringType *src = (flip ? temp_ : data_) + bgn;
  StringType *dst = (flip ? data_ : temp_) + bgn;
  uint8_t *let = letters8_ + bgn;
  size_t n = end - bgn;

  for (size_t i = 0; i < n; ++i) {
    let[i] = src[i][depth];
  }

  for (size_t i = 0; i < n; ++i) {
    ++cnt[let[i]];
  }

  size_t s = 0;
  for (int i = 0; i < 1 << 8; ++i) {
    std::swap(cnt[i], s);
    s += cnt[i];
  }

  for (size_t i = 0; i < n; ++i) {
    std::swap(dst[cnt[let[i]]++], src[i]);
  }

  if (flip == false) {
    size_t b = 0, e = cnt[0];
    for (size_t j = b; j < e; ++j) {
      std::swap(src[j], dst[j]);
    }
  }

  for (size_t i = 1; i < 1 << 8; ++i) {
    if (cnt[i] - cnt[i - 1] >= 1) {
      Recurse(bgn + cnt[i - 1], bgn + cnt[i], depth + 1, !flip);
    }
  }
}